

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O3

bool __thiscall cppnet::RWSocket::Write(RWSocket *this,char *src,uint32_t len)

{
  element_type *peVar1;
  element_type *peVar2;
  _func_int **pp_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  element_type *peVar5;
  undefined1 uVar6;
  int iVar7;
  uint uVar8;
  _Atomic_word _Var9;
  undefined4 extraout_var;
  bool bVar11;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  Event *pEVar10;
  
  if (this->_event == (Event *)0x0) {
    peVar1 = (((this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar7 = (*peVar1->_vptr_Alloter[3])(peVar1,0x28);
    pEVar10 = (Event *)CONCAT44(extraout_var,iVar7);
    if (pEVar10 != (Event *)0x0) {
      pEVar10->_vptr_Event = (_func_int **)&PTR__Event_001241a0;
      pEVar10->_data = (void *)0x0;
      pEVar10->_event_type = 0;
      (pEVar10->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pEVar10->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    this->_event = pEVar10;
    std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::RWSocket,void>
              ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::RWSocket>);
    peVar5 = local_50;
    local_40 = local_50;
    local_38._M_pi = p_Stack_48;
    local_50 = (element_type *)0x0;
    p_Stack_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pEVar10->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pEVar10->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_38);
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    if (p_Stack_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_48);
    }
  }
  iVar7 = (*(((this->_write_buffer).
              super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
  peVar2 = (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pp_Var3 = (peVar2->super_InnerBuffer).super_Buffer._vptr_Buffer;
  if (iVar7 == 0) {
    (*pp_Var3[10])(peVar2,src,(ulong)len);
    uVar6 = Send(this);
  }
  else {
    uVar8 = (*pp_Var3[8])();
    if (uVar8 < 0x400001) {
      peVar2 = (this->_write_buffer).
               super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar2->super_InnerBuffer).super_Buffer._vptr_Buffer[10])(peVar2,src,(ulong)len);
      this_00 = (this->super_Socket)._event_actions.
                super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Var9 = this_00->_M_use_count;
        while (_Var9 != 0) {
          LOCK();
          iVar7 = this_00->_M_use_count;
          bVar11 = _Var9 == iVar7;
          if (bVar11) {
            this_00->_M_use_count = _Var9 + 1;
            iVar7 = _Var9;
          }
          _Var9 = iVar7;
          UNLOCK();
          if (bVar11) {
            peVar4 = (this->super_Socket)._event_actions.
                     super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar4 == (element_type *)0x0 || this_00->_M_use_count == 0) {
              uVar6 = 0;
            }
            else {
              iVar7 = (*peVar4->_vptr_EventActions[4])(peVar4,this->_event);
              uVar6 = (undefined1)iVar7;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            return (bool)uVar6;
          }
        }
      }
    }
    uVar6 = 0;
  }
  return (bool)uVar6;
}

Assistant:

bool RWSocket::Write(const char* src, uint32_t len) {
    if (!_event) {
        _event = _alloter->PoolNew<Event>();
        _event->SetSocket(shared_from_this());
    }

    //can't send now
    if (_write_buffer->GetCanReadLength() > 0) {
        if (_write_buffer->GetCanReadLength() > __max_write_cache) {
            return false;
        }
        
        _write_buffer->Write(src, len);
        auto actions = GetEventActions();
        if (actions) {
            return actions->AddSendEvent(_event);
        }
        return false;

    } else {
        _write_buffer->Write(src, len);
        return Send();
    }
}